

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBinaryExpr
          (BinaryReaderInterp *this,Opcode opcode)

{
  Istream *this_00;
  bool bVar1;
  Enum op;
  Location local_40;
  Enum local_1c;
  BinaryReaderInterp *local_18;
  BinaryReaderInterp *this_local;
  Opcode opcode_local;
  
  local_18 = this;
  this_local._0_4_ = opcode.enum_;
  GetLocation(&local_40,this);
  local_1c = (Enum)SharedValidator::OnBinary(&this->validator_,&local_40,this_local._0_4_);
  bVar1 = Failed((Result)local_1c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
    Istream::Emit(this_00,op);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBinaryExpr(Opcode opcode) {
  CHECK_RESULT(validator_.OnBinary(GetLocation(), opcode));
  istream_.Emit(opcode);
  return Result::Ok;
}